

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.hpp
# Opt level: O1

QuadTerms * __thiscall
mp::BucketAccum1Type<mp::QuadTerms>::ExtractBucket
          (QuadTerms *__return_storage_ptr__,BucketAccum1Type<mp::QuadTerms> *this,size_t i)

{
  QuadTerms *other;
  
  if (i < 0x40) {
    other = (this->buckets_)._M_elems + i;
    gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
    move_initialize<8U,_nullptr>
              ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               __return_storage_ptr__,
               (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               other);
    gch::detail::small_vector_base<std::allocator<double>,_6U>::move_initialize<6U,_nullptr>
              (&(__return_storage_ptr__->coefs_aux_).
                super_small_vector_base<std::allocator<double>,_6U>,
               &(other->coefs_aux_).super_small_vector_base<std::allocator<double>,_6U>);
    gch::detail::small_vector_base<std::allocator<int>,_6U>::move_initialize<6U,_nullptr>
              (&(__return_storage_ptr__->vars1_aux_).
                super_small_vector_base<std::allocator<int>,_6U>,
               (small_vector_base<std::allocator<int>,_6U> *)(&other->coefs_aux_ + 1));
    gch::detail::small_vector_base<std::allocator<int>,_6U>::move_initialize<6U,_nullptr>
              (&(__return_storage_ptr__->vars2_aux_).
                super_small_vector_base<std::allocator<int>,_6U>,
               &((SmallVec<int,_6> *)(&other->coefs_aux_ + 1))[1].
                super_small_vector_base<std::allocator<int>,_6U>);
    (this->buckets_)._M_elems[i].folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size = 0
    ;
    (this->buckets_)._M_elems[i].coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
    m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    (this->buckets_)._M_elems[i].vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    (this->buckets_)._M_elems[i].vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",i,0x40);
}

Assistant:

Body BucketAccum1Type<Body>::ExtractBucket(size_t i) {
  Body result = std::move(buckets_.at(i));
  buckets_[i].clear();            // std::move does not
  return result;
}